

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O0

void draw_msgwin(void)

{
  bool bVar1;
  WINDOW_conflict *pWVar2;
  attr_t aVar3;
  int local_20;
  int local_18;
  int local_10;
  int iStack_c;
  nh_bool drew_older;
  int pos;
  int i;
  
  bVar1 = false;
  if (msgwin == (WINDOW_conflict *)0x0) {
    local_18 = -1;
  }
  else {
    local_18 = msgwin->_maxy + 1;
  }
  while (pWVar2 = msgwin, iStack_c = local_18 + -1, -1 < iStack_c) {
    if (msgwin == (WINDOW_conflict *)0x0) {
      local_20 = -1;
    }
    else {
      local_20 = msgwin->_maxy + 1;
    }
    local_10 = (curline - local_20) + 1 + iStack_c;
    if (local_10 < 0) {
      local_10 = local_10 + 0x28;
    }
    if (local_10 == start_of_turn_curline) {
      if (settings.darkmsg != '\0') {
        aVar3 = curses_color_attr(4,0);
        wattr_on(pWVar2,aVar3,0);
      }
      bVar1 = true;
    }
    wmove(msgwin,iStack_c,0);
    waddnstr(msgwin,msglines + local_10,0xffffffff);
    local_18 = iStack_c;
    if (((msgwin == (WINDOW_conflict *)0x0) || (msgwin->_curx != 0)) ||
       (msglines[local_10][0] == '\0')) {
      wclrtoeol(msgwin);
    }
  }
  if (bVar1) {
    if (settings.darkmsg != '\0') {
      aVar3 = curses_color_attr(4,0);
      wattr_off(pWVar2,aVar3,0);
    }
  }
  else {
    start_of_turn_curline = -1;
  }
  wnoutrefresh(msgwin);
  return;
}

Assistant:

void draw_msgwin(void)
{
    int i, pos;
    nh_bool drew_older = FALSE;

    for (i = getmaxy(msgwin) - 1; i >= 0; i--) {
	pos = curline - getmaxy(msgwin) + 1 + i;
	if (pos < 0)
	    pos += MAX_MSGLINES;
	if (pos == start_of_turn_curline) {
	    if (settings.darkmsg)
		wattron(msgwin, curses_color_attr(CLR_BLUE, 0));
	    drew_older = TRUE;
	}
	wmove(msgwin, i, 0);
	waddstr(msgwin, msglines[pos]);
	/* Only clear the remainder of the line if the cursor did not wrap. */
	if (getcurx(msgwin) || !*msglines[pos])
	    wclrtoeol(msgwin);
    }

    if (drew_older) {
	if (settings.darkmsg)
	    wattroff(msgwin, curses_color_attr(CLR_BLUE, 0));
    } else {
	/* Don't dim out messages if the message buffer wraps. */
	start_of_turn_curline = -1;
    }

    wnoutrefresh(msgwin);
}